

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_backend_nodes_makefuncs.cpp
# Opt level: O2

PGTypeName * duckdb_libpgquery::makeTypeName(char *typnam)

{
  PGValue *datum;
  PGList *names;
  PGTypeName *pPVar1;
  
  datum = makeString(typnam);
  names = lcons(datum,(PGList *)0x0);
  pPVar1 = makeTypeNameFromNameList(names);
  return pPVar1;
}

Assistant:

PGTypeName *makeTypeName(char *typnam) {
	return makeTypeNameFromNameList(list_make1(makeString(typnam)));
}